

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom JS_ValueToAtom(JSContext *ctx,JSValue val)

{
  JSRuntime *rt;
  JSAtomStruct *pJVar1;
  JSAtomStruct *p;
  JSAtom JVar2;
  JSValue JVar3;
  
  if ((int)val.u._0_4_ < 0 || (int)val.tag != 0) {
    if ((int)val.tag == -8) {
      rt = ctx->rt;
      JVar2 = js_get_atom_index(rt,(JSAtomStruct *)val.u.ptr);
      if (0xd1 < (int)JVar2) {
        pJVar1 = rt->atom_array[JVar2];
        (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
      }
    }
    else {
      JVar3 = JS_ToPropertyKey(ctx,val);
      if ((int)JVar3.tag != 6) {
        if ((int)JVar3.tag == -8) {
          JVar2 = js_get_atom_index(ctx->rt,(JSAtomStruct *)JVar3.u.ptr);
          return JVar2;
        }
        JVar2 = JS_NewAtomStr(ctx,(JSString *)JVar3.u.ptr);
        return JVar2;
      }
      JVar2 = 0;
    }
  }
  else {
    JVar2 = val.u._0_4_ | 0x80000000;
  }
  return JVar2;
}

Assistant:

JSAtom JS_ValueToAtom(JSContext *ctx, JSValueConst val)
{
    JSAtom atom;
    uint32_t tag;
    tag = JS_VALUE_GET_TAG(val);
    if (tag == JS_TAG_INT &&
        (uint32_t)JS_VALUE_GET_INT(val) <= JS_ATOM_MAX_INT) {
        /* fast path for integer values */
        atom = __JS_AtomFromUInt32(JS_VALUE_GET_INT(val));
    } else if (tag == JS_TAG_SYMBOL) {
        JSAtomStruct *p = JS_VALUE_GET_PTR(val);
        atom = JS_DupAtom(ctx, js_get_atom_index(ctx->rt, p));
    } else {
        JSValue str;
        str = JS_ToPropertyKey(ctx, val);
        if (JS_IsException(str))
            return JS_ATOM_NULL;
        if (JS_VALUE_GET_TAG(str) == JS_TAG_SYMBOL) {
            atom = js_symbol_to_atom(ctx, str);
        } else {
            atom = JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(str));
        }
    }
    return atom;
}